

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0041e3c8 == '\x01') {
    DAT_0041e3c8 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_0041e3f0 == '\x01') {
    DAT_0041e3f0 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_0041e420 == '\x01') {
    DAT_0041e420 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_0041e450 == '\x01') {
    DAT_0041e450 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_0041e478 == '\x01') {
    DAT_0041e478 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_0041e4c0 == '\x01') {
    DAT_0041e4c0 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_0041e4f8 == '\x01') {
    DAT_0041e4f8 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_0041e530 == '\x01') {
    DAT_0041e530 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_0041e560 == '\x01') {
    DAT_0041e560 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_0041e598 == '\x01') {
    DAT_0041e598 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_0041e5c8 == '\x01') {
    DAT_0041e5c8 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_0041e608 == '\x01') {
    DAT_0041e608 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_0041e6d0 == '\x01') {
    DAT_0041e6d0 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}